

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O3

RDL_cycleIterator * RDL_getRCyclesForRCFIterator(RDL_data *data,uint index)

{
  uint uVar1;
  uint rcf_index;
  uint bcc_index;
  RDL_cycleIterator *pRVar2;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
  }
  else {
    if (index < data->nofRCFs) {
      uVar1 = data->rcf_to_urf[index][0];
      rcf_index = data->rcf_to_urf[index][1];
      bcc_index = data->urf_to_bcc[uVar1][0];
      uVar1 = data->urf_to_bcc[uVar1][1];
      pRVar2 = RDL_initCycleIterator
                         (RDL_RCF_IT,rcf_index,rcf_index,uVar1,uVar1,bcc_index,bcc_index,'b',data);
      return pRVar2;
    }
    (*RDL_outputFunc)(RDL_ERROR,"invalid index: %u\n");
  }
  return (RDL_cycleIterator *)0x0;
}

Assistant:

RDL_cycleIterator* RDL_getRCyclesForRCFIterator(const RDL_data *data, unsigned index)
{
  RDL_cycleIterator* it;
  unsigned rcf_internal_index, urf_internal_index, urf_index;
  unsigned bcc_index;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    return NULL;
  }

  if (index >= data->nofRCFs) {
    RDL_outputFunc(RDL_ERROR, "invalid index: %u\n", index);
    return NULL;
  }

  urf_index = data->rcf_to_urf[index][0];
  rcf_internal_index = data->rcf_to_urf[index][1];
  bcc_index = data->urf_to_bcc[urf_index][0];
  urf_internal_index = data->urf_to_bcc[urf_index][1];

  it = RDL_initCycleIterator(RDL_RCF_IT,
      rcf_internal_index, rcf_internal_index,
      urf_internal_index, urf_internal_index,
      bcc_index, bcc_index,
      'b', data);

  return it;
}